

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

void capnp::compiler::anon_unknown_0::checkExampleStruct(Reader reader,uint sharedOrdinalCount)

{
  ushort uVar1;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  StructSchema SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  StructSchema schema;
  FieldSubset unionFields;
  Field field;
  Schema local_140;
  FieldSubset local_138;
  Schema local_f0;
  uint uStack_e8;
  undefined4 uStack_e4;
  SegmentReader *in_stack_ffffffffffffff20;
  CapTableReader *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  WirePointer *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  Schema SVar9;
  undefined4 in_stack_ffffffffffffff5c;
  StructReader local_a0;
  RawBrandedSchema *local_70;
  uint uStack_68;
  StructReader local_60;
  
  local_140 = reader.schema.super_Schema.raw;
  StructSchema::getNonUnionFields(&local_138,(StructSchema *)&local_140);
  uVar7 = (ulong)local_138.size_;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      SVar2.super_Schema.raw = local_138.parent.super_Schema.raw;
      uVar1 = local_138.indices[uVar6];
      capnp::_::ListReader::getStructElement
                ((StructReader *)&stack0xffffffffffffff20,&local_138.list.reader,(uint)uVar1);
      local_f0 = SVar2.super_Schema.raw;
      field_00._12_4_ = uStack_e4;
      field_00.index = (uint)uVar1;
      field_00.parent.super_Schema.raw = SVar2.super_Schema.raw;
      field_00.proto._reader.segment = in_stack_ffffffffffffff20;
      field_00.proto._reader.capTable = in_stack_ffffffffffffff28;
      field_00.proto._reader.data = in_stack_ffffffffffffff30;
      field_00.proto._reader.pointers = in_stack_ffffffffffffff38;
      field_00.proto._reader.dataSize = (StructDataBitCount)in_stack_ffffffffffffff40;
      field_00.proto._reader.pointerCount = SUB82(in_stack_ffffffffffffff40,4);
      field_00.proto._reader._38_2_ = SUB82(in_stack_ffffffffffffff40,6);
      field_00.proto._reader.nestingLimit = (int)in_stack_ffffffffffffff48;
      field_00.proto._reader._44_4_ = SUB84(in_stack_ffffffffffffff48,4);
      uStack_e8 = (uint)uVar1;
      checkExampleField(reader,field_00,sharedOrdinalCount);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  StructSchema::getUnionFields(&local_138,(StructSchema *)&local_140);
  uVar7 = (ulong)local_138.size_;
  uVar5 = local_138.size_ + 1;
  do {
    SVar9 = local_138.parent.super_Schema.raw;
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) {
      return;
    }
    uVar1 = local_138.indices[uVar7];
    uVar4 = (uint)uVar1;
    capnp::_::ListReader::getStructElement(&local_a0,&local_138.list.reader,(uint)uVar1);
    field_02._8_8_ = in_stack_ffffffffffffff28;
    field_02.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff20;
    field_02.proto._reader.segment = (SegmentReader *)in_stack_ffffffffffffff30;
    field_02.proto._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff38;
    field_02.proto._reader.data = (void *)in_stack_ffffffffffffff40;
    field_02.proto._reader.pointers = (WirePointer *)in_stack_ffffffffffffff48;
    field_02.proto._reader._32_8_ = SVar9.raw;
    field_02.proto._reader.nestingLimit._0_2_ = uVar1;
    field_02.proto._reader.nestingLimit._2_2_ = 0;
    field_02.proto._reader._44_4_ = in_stack_ffffffffffffff5c;
    uVar3 = getOrdinal(field_02);
    local_70 = (RawBrandedSchema *)local_138.parent;
    uVar5 = uVar5 - 1;
  } while (sharedOrdinalCount <= uVar3);
  uVar1 = *local_138.indices;
  capnp::_::ListReader::getStructElement(&local_60,&local_138.list.reader,(uint)uVar1);
  field_03._8_8_ = in_stack_ffffffffffffff28;
  field_03.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff20;
  field_03.proto._reader.segment = (SegmentReader *)in_stack_ffffffffffffff30;
  field_03.proto._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff38;
  field_03.proto._reader.data = (void *)in_stack_ffffffffffffff40;
  field_03.proto._reader.pointers = (WirePointer *)in_stack_ffffffffffffff48;
  field_03.proto._reader._32_8_ = SVar9.raw;
  field_03.proto._reader.nestingLimit = uVar4;
  field_03.proto._reader._44_4_ = in_stack_ffffffffffffff5c;
  uStack_68 = (uint)uVar1;
  uVar3 = getOrdinal(field_03);
  uVar1 = local_138.indices[(ulong)uVar3 % (ulong)uVar5];
  capnp::_::ListReader::getStructElement
            ((StructReader *)&stack0xffffffffffffff20,&local_138.list.reader,(uint)uVar1);
  local_f0 = local_138.parent.super_Schema.raw;
  field_01._12_4_ = uStack_e4;
  field_01.index = (uint)uVar1;
  field_01.parent.super_Schema.raw = local_138.parent.super_Schema.raw;
  field_01.proto._reader.segment = in_stack_ffffffffffffff20;
  field_01.proto._reader.capTable = in_stack_ffffffffffffff28;
  field_01.proto._reader.data = in_stack_ffffffffffffff30;
  field_01.proto._reader.pointers = in_stack_ffffffffffffff38;
  field_01.proto._reader.dataSize = (StructDataBitCount)in_stack_ffffffffffffff40;
  field_01.proto._reader.pointerCount = SUB82(in_stack_ffffffffffffff40,4);
  field_01.proto._reader._38_2_ = SUB82(in_stack_ffffffffffffff40,6);
  field_01.proto._reader.nestingLimit = (int)in_stack_ffffffffffffff48;
  field_01.proto._reader._44_4_ = SUB84(in_stack_ffffffffffffff48,4);
  uStack_e8 = (uint)uVar1;
  checkExampleField(reader,field_01,sharedOrdinalCount);
  return;
}

Assistant:

void checkExampleStruct(DynamicStruct::Reader reader, uint sharedOrdinalCount) {
  auto schema = reader.getSchema();

  for (auto field: schema.getNonUnionFields()) {
    checkExampleField(reader, field, sharedOrdinalCount);
  }

  auto unionFields = schema.getUnionFields();

  // Pretend the union doesn't have any fields that aren't in the shared ordinal range.
  uint range = unionFields.size();
  while (range > 0 && getOrdinal(unionFields[range - 1]) >= sharedOrdinalCount) {
    --range;
  }

  if (range > 0) {
    auto field = unionFields[getOrdinal(unionFields[0]) % range];
    checkExampleField(reader, field, sharedOrdinalCount);
  }
}